

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

Curve * Assimp::IFC::Curve::Convert(IfcCurve *curve,ConversionData *conv)

{
  IfcBoundedCurve *pIVar1;
  IfcPolyline *entity;
  PolyLine *this;
  IfcTrimmedCurve *entity_00;
  TrimmedCurve *this_00;
  IfcCompositeCurve *entity_01;
  CompositeCurve *this_01;
  IfcConic *pIVar2;
  IfcCircle *entity_02;
  Circle *this_02;
  IfcEllipse *entity_03;
  Ellipse *this_03;
  IfcLine *entity_04;
  IfcLine *c_5;
  IfcEllipse *c_4;
  IfcCircle *c_3;
  IfcCompositeCurve *c_2;
  IfcTrimmedCurve *c_1;
  IfcPolyline *c;
  ConversionData *conv_local;
  IfcCurve *curve_local;
  
  pIVar1 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcBoundedCurve>
                     ((Object *)
                      ((long)&(curve->super_IfcGeometricRepresentationItem).
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper +
                      (long)(curve->super_IfcGeometricRepresentationItem).
                            super_IfcRepresentationItem.
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                            _vptr_ObjectHelper[-3]));
  if (pIVar1 != (IfcBoundedCurve *)0x0) {
    entity = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPolyline>
                       ((Object *)
                        ((long)&(curve->super_IfcGeometricRepresentationItem).
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper +
                        (long)(curve->super_IfcGeometricRepresentationItem).
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper[-3]));
    if (entity != (IfcPolyline *)0x0) {
      this = (PolyLine *)operator_new(0x30);
      anon_unknown_9::PolyLine::PolyLine(this,entity,conv);
      return (Curve *)this;
    }
    entity_00 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcTrimmedCurve>
                          ((Object *)
                           ((long)&(curve->super_IfcGeometricRepresentationItem).
                                   super_IfcRepresentationItem.
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   ._vptr_ObjectHelper +
                           (long)(curve->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper[-3]));
    if (entity_00 != (IfcTrimmedCurve *)0x0) {
      this_00 = (TrimmedCurve *)operator_new(0x48);
      anon_unknown_9::TrimmedCurve::TrimmedCurve(this_00,entity_00,conv);
      return (Curve *)this_00;
    }
    entity_01 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcCompositeCurve>
                          ((Object *)
                           ((long)&(curve->super_IfcGeometricRepresentationItem).
                                   super_IfcRepresentationItem.
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   ._vptr_ObjectHelper +
                           (long)(curve->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper[-3]));
    if (entity_01 != (IfcCompositeCurve *)0x0) {
      this_01 = (CompositeCurve *)operator_new(0x38);
      anon_unknown_9::CompositeCurve::CompositeCurve(this_01,entity_01,conv);
      return (Curve *)this_01;
    }
  }
  pIVar2 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcConic>
                     ((Object *)
                      ((long)&(curve->super_IfcGeometricRepresentationItem).
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper +
                      (long)(curve->super_IfcGeometricRepresentationItem).
                            super_IfcRepresentationItem.
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                            _vptr_ObjectHelper[-3]));
  if (pIVar2 != (IfcConic *)0x0) {
    entity_02 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcCircle>
                          ((Object *)
                           ((long)&(curve->super_IfcGeometricRepresentationItem).
                                   super_IfcRepresentationItem.
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   ._vptr_ObjectHelper +
                           (long)(curve->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper[-3]));
    if (entity_02 != (IfcCircle *)0x0) {
      this_02 = (Circle *)operator_new(0x80);
      anon_unknown_9::Circle::Circle(this_02,entity_02,conv);
      return (Curve *)this_02;
    }
    entity_03 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcEllipse>
                          ((Object *)
                           ((long)&(curve->super_IfcGeometricRepresentationItem).
                                   super_IfcRepresentationItem.
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   ._vptr_ObjectHelper +
                           (long)(curve->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper[-3]));
    if (entity_03 != (IfcEllipse *)0x0) {
      this_03 = (Ellipse *)operator_new(0x80);
      anon_unknown_9::Ellipse::Ellipse(this_03,entity_03,conv);
      return (Curve *)this_03;
    }
  }
  entity_04 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcLine>
                        ((Object *)
                         ((long)&(curve->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper +
                         (long)(curve->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper[-3]));
  if (entity_04 == (IfcLine *)0x0) {
    curve_local = (IfcCurve *)0x0;
  }
  else {
    curve_local = (IfcCurve *)operator_new(0x48);
    anon_unknown_9::Line::Line((Line *)curve_local,entity_04,conv);
  }
  return (Curve *)curve_local;
}

Assistant:

Curve* Curve::Convert(const IFC::Schema_2x3::IfcCurve& curve,ConversionData& conv) {
    if(curve.ToPtr<Schema_2x3::IfcBoundedCurve>()) {
        if(const Schema_2x3::IfcPolyline* c = curve.ToPtr<Schema_2x3::IfcPolyline>()) {
            return new PolyLine(*c,conv);
        }
        if(const Schema_2x3::IfcTrimmedCurve* c = curve.ToPtr<Schema_2x3::IfcTrimmedCurve>()) {
            return new TrimmedCurve(*c,conv);
        }
        if(const Schema_2x3::IfcCompositeCurve* c = curve.ToPtr<Schema_2x3::IfcCompositeCurve>()) {
            return new CompositeCurve(*c,conv);
        }
    }

    if(curve.ToPtr<Schema_2x3::IfcConic>()) {
        if(const Schema_2x3::IfcCircle* c = curve.ToPtr<Schema_2x3::IfcCircle>()) {
            return new Circle(*c,conv);
        }
        if(const Schema_2x3::IfcEllipse* c = curve.ToPtr<Schema_2x3::IfcEllipse>()) {
            return new Ellipse(*c,conv);
        }
    }

    if(const Schema_2x3::IfcLine* c = curve.ToPtr<Schema_2x3::IfcLine>()) {
        return new Line(*c,conv);
    }

    // XXX OffsetCurve2D, OffsetCurve3D not currently supported
    return NULL;
}